

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InstructionFolder::FoldInstruction(InstructionFolder *this,Instruction *inst)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar1 = false;
  do {
    bVar3 = bVar1;
    if (inst->opcode_ == OpCopyObject) {
      return bVar3;
    }
    bVar2 = FoldInstructionInternal(this,inst);
    bVar1 = true;
  } while (bVar2);
  return bVar3;
}

Assistant:

bool InstructionFolder::FoldInstruction(Instruction* inst) const {
  bool modified = false;
  Instruction* folded_inst(inst);
  while (folded_inst->opcode() != spv::Op::OpCopyObject &&
         FoldInstructionInternal(&*folded_inst)) {
    modified = true;
  }
  return modified;
}